

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2mat.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  string *filename;
  MidiFile midifile;
  MidiFile local_90;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::reserve(&matlabarray,100000);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&matlabarray);
  std::vector<int,_std::allocator<int>_>::resize(&legend_instr,0x80);
  std::vector<int,_std::allocator<int>_>::resize(&legend_opcode,0x80);
  std::vector<int,_std::allocator<int>_>::resize(&legend_controller,0x80);
  checkOptions(&options,argc,argv);
  filename = smf::Options::getArg_abi_cxx11_(&options,1);
  smf::MidiFile::MidiFile(&local_90,filename);
  convertMidiFile(&local_90,&matlabarray);
  if (verboseQ == 0) {
    printMatlabArray(&local_90,&matlabarray);
  }
  smf::MidiFile::~MidiFile(&local_90);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
	matlabarray.reserve(100000);
	matlabarray.clear();

	legend_instr.resize(128);
	legend_opcode.resize(128);
	legend_controller.resize(128);

	checkOptions(options, argc, argv);
	MidiFile midifile(options.getArg(1));

	convertMidiFile(midifile, matlabarray);
	if (!verboseQ) {
		printMatlabArray(midifile, matlabarray);
	}
	return 0;
}